

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::parseBranchDirective
          (Preprocessor *this,Token directive,ConditionalDirectiveExpressionSyntax *expr,bool taken)

{
  SmallVector<slang::parsing::Token,_2UL> *this_00;
  BumpAllocator *this_01;
  Token TVar1;
  SyntaxKind SVar2;
  int iVar3;
  undefined4 extraout_var;
  ConditionalBranchDirectiveSyntax *syntax;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX_00;
  undefined7 in_register_00000081;
  SyntaxKind local_64;
  Token token;
  Token directive_local;
  Trivia local_40;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  this_00 = &this->scratchTokenBuffer;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  if ((int)CONCAT71(in_register_00000081,taken) == 0) {
    do {
      token = nextRaw(this);
      if (token.kind == Directive) {
        SVar2 = Token::directiveKind(&token);
        if (((SVar2 - ElseDirective < 0x40) &&
            ((0xa000000000000801U >> ((ulong)(SVar2 - ElseDirective) & 0x3f) & 1) != 0)) ||
           (SVar2 == ElsIfDirective)) goto LAB_00193e62;
      }
      else if (token.kind == EndOfFile) goto LAB_00193e62;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&token);
    } while( true );
  }
LAB_00193e6f:
  this_01 = this->alloc;
  if (expr == (ConditionalDirectiveExpressionSyntax *)0x0) {
    local_64 = Token::directiveKind(&directive_local);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src_00);
    token.rawLen = extraout_var_00;
    token.kind = (short)iVar3;
    token._2_1_ = (char)((uint)iVar3 >> 0x10);
    token.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    token.info = extraout_RDX_00;
    syntax = (ConditionalBranchDirectiveSyntax *)
             BumpAllocator::
             emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,std::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_64,&directive_local,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&token);
  }
  else {
    local_64 = Token::directiveKind(&directive_local);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    token.rawLen = extraout_var;
    token.kind = (short)iVar3;
    token._2_1_ = (char)((uint)iVar3 >> 0x10);
    token.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    token.info = extraout_RDX;
    syntax = BumpAllocator::
             emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::syntax::ConditionalDirectiveExpressionSyntax&,std::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_64,&directive_local,expr,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&token);
  }
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)syntax);
  return local_40;
LAB_00193e62:
  TVar1 = token;
  (this->currentToken).kind = token.kind;
  (this->currentToken).field_0x2 = token._2_1_;
  (this->currentToken).numFlags = (NumericTokenFlags)token.numFlags.raw;
  (this->currentToken).rawLen = token.rawLen;
  (this->currentToken).info = token.info;
  token = TVar1;
  goto LAB_00193e6f;
}

Assistant:

Trivia Preprocessor::parseBranchDirective(Token directive,
                                          syntax::ConditionalDirectiveExpressionSyntax* expr,
                                          bool taken) {
    scratchTokenBuffer.clear();
    if (!taken) {
        // skip over everything until we find another conditional compilation directive
        while (true) {
            auto token = nextRaw();

            // EoF or conditional directive stops the skipping process
            bool done = false;
            if (token.kind == TokenKind::EndOfFile) {
                done = true;
            }
            else if (token.kind == TokenKind::Directive) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        done = true;
                        break;
                    default:
                        break;
                }
            }

            if (done) {
                // put the token back so that we'll look at it next
                currentToken = token;
                break;
            }
            scratchTokenBuffer.push_back(token);
        }
    }

    SyntaxNode* syntax;
    if (expr) {
        syntax = alloc.emplace<ConditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                 directive, *expr,
                                                                 scratchTokenBuffer.copy(alloc));
    }
    else {
        syntax = alloc.emplace<UnconditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                   directive,
                                                                   scratchTokenBuffer.copy(alloc));
    }
    return Trivia(TriviaKind::Directive, syntax);
}